

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

Option * __thiscall CLI::App::set_help_flag(App *this,string *name,string *description)

{
  ulong uVar1;
  Option *pOVar2;
  string local_88;
  anon_class_1_0_00000001 local_61;
  function<void_(unsigned_long)> local_60;
  string local_40;
  string *local_20;
  string *description_local;
  string *name_local;
  App *this_local;
  
  local_20 = description;
  description_local = name;
  name_local = (string *)this;
  if (this->help_ptr_ != (Option *)0x0) {
    remove_option(this,this->help_ptr_);
    this->help_ptr_ = (Option *)0x0;
  }
  uVar1 = ::std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    ::std::__cxx11::string::string((string *)&local_40,(string *)name);
    ::std::function<void(unsigned_long)>::
    function<CLI::App::set_help_flag(std::__cxx11::string,std::__cxx11::string)::_lambda(unsigned_long)_1_,void>
              ((function<void(unsigned_long)> *)&local_60,&local_61);
    ::std::__cxx11::string::string((string *)&local_88,(string *)description);
    pOVar2 = add_flag_function(this,&local_40,&local_60,&local_88);
    this->help_ptr_ = pOVar2;
    ::std::__cxx11::string::~string((string *)&local_88);
    std::function<void_(unsigned_long)>::~function(&local_60);
    ::std::__cxx11::string::~string((string *)&local_40);
    Option::short_circuit(this->help_ptr_,true);
    OptionBase<CLI::Option>::configurable(&this->help_ptr_->super_OptionBase<CLI::Option>,false);
  }
  return this->help_ptr_;
}

Assistant:

Option *set_help_flag(std::string name = "", std::string description = "") {
        if(help_ptr_ != nullptr) {
            remove_option(help_ptr_);
            help_ptr_ = nullptr;
        }

        // Empty name will simply remove the help flag
        if(!name.empty()) {
            help_ptr_ = add_flag_function(name, [](size_t) -> void { throw CallForHelp(); }, description);
            help_ptr_->short_circuit(true);
            help_ptr_->configurable(false);
        }

        return help_ptr_;
    }